

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O2

void __thiscall
test_adjacency_graph_erase_if_directed_Test::~test_adjacency_graph_erase_if_directed_Test
          (test_adjacency_graph_erase_if_directed_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, erase_if_directed) {
  Adjacency_Graph<true> square_graph = create_graph_structured<true>(4);

  // remap 1 -> 0, 3 -> 1, 5 -> 2, 7 -> 3, 9 -> 4, 11 -> 5, 13 -> 6, 15 -> 7
  auto erase_if_even = [](const auto& i_vertex) {
    return i_vertex % 2 == 0;
  };
  Adjacency_Graph<true> answer({{0, 2}, {1, 3}, {2, 4}, {3, 5}, {4, 6}, {5, 7}});  // only up connection survive
  answer.resize(8);  // should be one extra vertex which is not connected to anything.

  square_graph.erase_if(erase_if_even);
  FOR(i_vertex, answer.size_vertex())
  FOR(i_adjacent, answer[i_vertex].size())
  EXPECT_EQ(answer[i_vertex][i_adjacent], square_graph[i_vertex][i_adjacent]);
}